

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::TSPI_PDU::SetEntityOrientationFlag(TSPI_PDU *this,KBOOL F)

{
  KBOOL F_local;
  TSPI_PDU *this_local;
  
  if (F != (KBOOL)((this->m_TSPIFlagUnion).m_ui8Flag >> 1 & 1)) {
    (this->m_TSPIFlagUnion).m_ui8Flag = (this->m_TSPIFlagUnion).m_ui8Flag & 0xfd | F << 1;
    if (F) {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength + 3;
    }
    else {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength - 3;
    }
  }
  return;
}

Assistant:

void TSPI_PDU::SetEntityOrientationFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_TSPIFlagUnion.m_ui8Ori )return;

    m_TSPIFlagUnion.m_ui8Ori = F;

    if( F )
    {
        m_ui16PDULength += LE_EulerAngles::LE_EULER_ANGLES_SIZE;
    }
    else
    {
        m_ui16PDULength -= LE_EulerAngles::LE_EULER_ANGLES_SIZE;
    }
}